

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_mpsadbw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t offset)

{
  uint32_t uVar1;
  undefined4 uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  long lVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  ZMMReg r;
  
  uVar1 = s->_l_ZMMReg[offset & 3];
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    uVar2 = *(undefined4 *)((long)d + lVar7 + (ulong)(offset & 4));
    sVar8 = ((ushort)uVar2 & 0xff) - (ushort)(byte)uVar1;
    sVar9 = (ushort)(byte)((uint)uVar2 >> 8) - (ushort)(byte)(uVar1 >> 8);
    sVar10 = (ushort)(byte)((uint)uVar2 >> 0x10) - (ushort)(byte)(uVar1 >> 0x10);
    sVar11 = (ushort)(byte)((uint)uVar2 >> 0x18) - (ushort)(byte)(uVar1 >> 0x18);
    sVar3 = -sVar8;
    sVar4 = -sVar9;
    sVar5 = -sVar10;
    sVar6 = -sVar11;
    *(ushort *)((long)&r + lVar7 * 2) =
         ((ushort)(sVar6 < sVar11) * sVar11 | (ushort)(sVar6 >= sVar11) * sVar6) +
         ((ushort)(sVar4 < sVar9) * sVar9 | (ushort)(sVar4 >= sVar9) * sVar4) +
         ((ushort)(sVar5 < sVar10) * sVar10 | (ushort)(sVar5 >= sVar10) * sVar5) +
         ((ushort)(sVar3 < sVar8) * sVar8 | (ushort)(sVar3 >= sVar8) * sVar3);
  }
  d->_q_ZMMReg[6] = r._q_ZMMReg[6];
  d->_q_ZMMReg[7] = r._q_ZMMReg[7];
  d->_q_ZMMReg[4] = r._q_ZMMReg[4];
  d->_q_ZMMReg[5] = r._q_ZMMReg[5];
  d->_q_ZMMReg[2] = r._q_ZMMReg[2];
  d->_q_ZMMReg[3] = r._q_ZMMReg[3];
  d->_q_ZMMReg[0] = r._q_ZMMReg[0];
  d->_q_ZMMReg[1] = r._q_ZMMReg[1];
  return;
}

Assistant:

void glue(helper_mpsadbw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                  uint32_t offset)
{
    int s0 = (offset & 3) << 2;
    int d0 = (offset & 4) << 0;
    int i;
    Reg r;

    for (i = 0; i < 8; i++, d0++) {
        r.W(i) = 0;
        r.W(i) += abs1(d->B(d0 + 0) - s->B(s0 + 0));
        r.W(i) += abs1(d->B(d0 + 1) - s->B(s0 + 1));
        r.W(i) += abs1(d->B(d0 + 2) - s->B(s0 + 2));
        r.W(i) += abs1(d->B(d0 + 3) - s->B(s0 + 3));
    }

    *d = r;
}